

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int LoadEXRFromMemory(float **out_rgba,int *width,int *height,uchar *memory,size_t size,char **err)

{
  char cVar1;
  uchar *puVar2;
  uchar **ppuVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  float *pfVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  EXRTile *pEVar17;
  long lVar18;
  size_t i_1;
  long lVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  size_t j;
  long lVar23;
  float fVar24;
  int local_3fc;
  EXRImage exr_image;
  string local_378;
  EXRVersion exr_version;
  EXRHeader exr_header;
  stringstream ss;
  ostream local_1a8 [376];
  
  if (out_rgba == (float **)0x0 || memory == (uchar *)0x0) {
    std::__cxx11::string::string
              ((string *)&exr_header,"Invalid argument for LoadEXRFromMemory",(allocator *)&ss);
    tinyexr::SetErrorMessage((string *)&exr_header,err);
    std::__cxx11::string::~string((string *)&exr_header);
    return -3;
  }
  memset(&exr_header,0,0x188);
  iVar5 = ParseEXRVersionFromMemory(&exr_version,memory,size);
  if (iVar5 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar6 = std::operator<<(local_1a8,"Failed to parse EXR version. code(");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
    std::operator<<(poVar6,")");
    std::__cxx11::stringbuf::str();
    tinyexr::SetErrorMessage(&local_378,err);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return iVar5;
  }
  iVar5 = ParseEXRHeaderFromMemory(&exr_header,&exr_version,memory,size,err);
  if (iVar5 != 0) {
    return iVar5;
  }
  for (lVar9 = 0; lVar9 < exr_header.num_channels; lVar9 = lVar9 + 1) {
    if (exr_header.pixel_types[lVar9] == 1) {
      exr_header.requested_pixel_types[lVar9] = 2;
    }
  }
  exr_image.width = 0;
  exr_image.height = 0;
  exr_image.num_channels = 0;
  exr_image.num_tiles = 0;
  exr_image.level_x = 0;
  exr_image.level_y = 0;
  exr_image.images = (uchar **)0x0;
  exr_image.tiles = (EXRTile *)0x0;
  exr_image.next_level = (TEXRImage *)0x0;
  iVar5 = LoadEXRImageFromMemory(&exr_image,&exr_header,memory,size,err);
  if (iVar5 != 0) {
    return iVar5;
  }
  uVar10 = 0;
  uVar14 = 0;
  if (0 < exr_header.num_channels) {
    uVar14 = (ulong)(uint)exr_header.num_channels;
  }
  pcVar8 = (exr_header.channels)->name + 1;
  local_3fc = -1;
  uVar12 = 0xffffffff;
  uVar21 = 0xffffffff;
  uVar16 = 0xffffffff;
  for (; uVar14 != uVar10; uVar10 = uVar10 + 1) {
    cVar1 = ((EXRChannelInfo *)(pcVar8 + -1))->name[0];
    if (cVar1 == 'R') {
      if (*pcVar8 == '\0') {
        uVar16 = uVar10 & 0xffffffff;
      }
    }
    else if (cVar1 == 'A') {
      if (*pcVar8 == '\0') {
        local_3fc = (int)uVar10;
      }
    }
    else if (cVar1 == 'B') {
      if (*pcVar8 == '\0') {
        uVar12 = uVar10 & 0xffffffff;
      }
    }
    else if ((cVar1 == 'G') && (*pcVar8 == '\0')) {
      uVar21 = uVar10 & 0xffffffff;
    }
    pcVar8 = pcVar8 + 0x110;
  }
  iVar5 = exr_image.width;
  iVar4 = exr_image.height;
  if (exr_header.num_channels == 1) {
    uVar10 = (ulong)exr_image.width;
    uVar14 = (ulong)exr_image.height;
    lVar9 = uVar10 * uVar14;
    pfVar7 = (float *)malloc(lVar9 * 0x10);
    *out_rgba = pfVar7;
    if (exr_header.tiled == 0) {
      for (lVar18 = 0; lVar9 - lVar18 != 0; lVar18 = lVar18 + 1) {
        fVar24 = *(float *)(*exr_image.images + lVar18 * 4);
        *pfVar7 = fVar24;
        pfVar7[1] = fVar24;
        pfVar7[2] = fVar24;
        pfVar7[3] = fVar24;
        pfVar7 = pfVar7 + 4;
      }
    }
    else {
      lVar9 = (long)exr_header.tile_size_x;
      uVar16 = 0;
      uVar12 = (ulong)(uint)exr_image.num_tiles;
      if (exr_image.num_tiles < 1) {
        uVar12 = uVar16;
      }
      for (; uVar16 != uVar12; uVar16 = uVar16 + 1) {
        pEVar17 = exr_image.tiles + uVar16;
        lVar18 = 0;
        for (lVar23 = 0; lVar23 != exr_header.tile_size_y; lVar23 = lVar23 + 1) {
          for (lVar19 = 0; lVar9 != lVar19; lVar19 = lVar19 + 1) {
            uVar21 = pEVar17->offset_x * lVar9 + lVar19;
            if ((uVar21 < uVar10) &&
               (uVar13 = (long)pEVar17->offset_y * (long)exr_header.tile_size_y + lVar23,
               uVar13 < uVar14)) {
              lVar22 = uVar21 + uVar13 * uVar10;
              puVar2 = *pEVar17->images;
              fVar24 = *(float *)(puVar2 + lVar19 * 4 + lVar18);
              pfVar7[lVar22 * 4] = fVar24;
              pfVar7[lVar22 * 4 + 1] = fVar24;
              fVar24 = *(float *)(puVar2 + lVar19 * 4 + lVar18);
              pfVar7[lVar22 * 4 + 2] = fVar24;
              pfVar7[lVar22 * 4 + 3] = fVar24;
            }
          }
          lVar18 = lVar18 + lVar9 * 4;
        }
      }
    }
LAB_00105ff7:
    *width = iVar5;
    *height = iVar4;
    FreeEXRHeader(&exr_header);
    FreeEXRImage(&exr_image);
    iVar5 = 0;
  }
  else {
    iVar15 = (int)uVar16;
    if (iVar15 == -1) {
      pcVar8 = "R channel not found";
    }
    else {
      iVar20 = (int)uVar21;
      if (iVar20 == -1) {
        pcVar8 = "G channel not found";
      }
      else {
        iVar11 = (int)uVar12;
        if (iVar11 != -1) {
          uVar14 = (ulong)exr_image.width;
          uVar10 = (ulong)exr_image.height;
          lVar9 = uVar14 * uVar10;
          pfVar7 = (float *)malloc(lVar9 * 0x10);
          *out_rgba = pfVar7;
          if (exr_header.tiled == 0) {
            pfVar7 = pfVar7 + 3;
            for (lVar18 = 0; lVar9 - lVar18 != 0; lVar18 = lVar18 + 1) {
              pfVar7[-3] = *(float *)(exr_image.images[iVar15] + lVar18 * 4);
              pfVar7[-2] = *(float *)(exr_image.images[iVar20] + lVar18 * 4);
              pfVar7[-1] = *(float *)(exr_image.images[iVar11] + lVar18 * 4);
              fVar24 = 1.0;
              if (local_3fc != -1) {
                fVar24 = *(float *)(exr_image.images[local_3fc] + lVar18 * 4);
              }
              *pfVar7 = fVar24;
              pfVar7 = pfVar7 + 4;
            }
          }
          else {
            lVar9 = (long)exr_header.tile_size_x;
            uVar16 = 0;
            uVar12 = (ulong)(uint)exr_image.num_tiles;
            if (exr_image.num_tiles < 1) {
              uVar12 = uVar16;
            }
            for (; uVar16 != uVar12; uVar16 = uVar16 + 1) {
              pEVar17 = exr_image.tiles + uVar16;
              lVar18 = 0;
              for (lVar23 = 0; lVar23 != exr_header.tile_size_y; lVar23 = lVar23 + 1) {
                for (lVar19 = 0; lVar9 != lVar19; lVar19 = lVar19 + 1) {
                  uVar21 = pEVar17->offset_x * lVar9 + lVar19;
                  if ((uVar21 < uVar14) &&
                     (uVar13 = (long)pEVar17->offset_y * (long)exr_header.tile_size_y + lVar23,
                     uVar13 < uVar10)) {
                    lVar22 = uVar21 + uVar13 * uVar14;
                    ppuVar3 = pEVar17->images;
                    pfVar7[lVar22 * 4] = *(float *)(ppuVar3[iVar15] + lVar19 * 4 + lVar18);
                    pfVar7[lVar22 * 4 + 1] = *(float *)(ppuVar3[iVar20] + lVar19 * 4 + lVar18);
                    pfVar7[lVar22 * 4 + 2] = *(float *)(ppuVar3[iVar11] + lVar19 * 4 + lVar18);
                    fVar24 = 1.0;
                    if (local_3fc != -1) {
                      fVar24 = *(float *)(ppuVar3[local_3fc] + lVar19 * 4 + lVar18);
                    }
                    pfVar7[lVar22 * 4 + 3] = fVar24;
                  }
                }
                lVar18 = lVar18 + lVar9 * 4;
              }
            }
          }
          goto LAB_00105ff7;
        }
        pcVar8 = "B channel not found";
      }
    }
    std::__cxx11::string::string((string *)&ss,pcVar8,(allocator *)&local_378);
    tinyexr::SetErrorMessage((string *)&ss,err);
    std::__cxx11::string::~string((string *)&ss);
    iVar5 = -4;
  }
  return iVar5;
}

Assistant:

int LoadEXRFromMemory(float **out_rgba, int *width, int *height,
                      const unsigned char *memory, size_t size,
                      const char **err) {
  if (out_rgba == NULL || memory == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXRFromMemory", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;

  InitEXRHeader(&exr_header);

  int ret = ParseEXRVersionFromMemory(&exr_version, memory, size);
  if (ret != TINYEXR_SUCCESS) {
    std::stringstream ss;
    ss << "Failed to parse EXR version. code(" << ret << ")";
    tinyexr::SetErrorMessage(ss.str(), err);
    return ret;
  }

  ret = ParseEXRHeaderFromMemory(&exr_header, &exr_version, memory, size, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exr_header.num_channels; i++) {
    if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  InitEXRImage(&exr_image);
  ret = LoadEXRImageFromMemory(&exr_image, &exr_header, memory, size, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exr_header.num_channels; c++) {
    if (strcmp(exr_header.channels[c].name, "R") == 0) {
      idxR = c;
    } else if (strcmp(exr_header.channels[c].name, "G") == 0) {
      idxG = c;
    } else if (strcmp(exr_header.channels[c].name, "B") == 0) {
      idxB = c;
    } else if (strcmp(exr_header.channels[c].name, "A") == 0) {
      idxA = c;
    }
  }

  // TODO(syoyo): Refactor removing same code as used in LoadEXR().
  if (exr_header.num_channels == 1) {
    // Grayscale channel only.

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      const size_t tile_size_x = static_cast<size_t>(exr_header.tile_size_x);
      const size_t tile_size_y = static_cast<size_t>(exr_header.tile_size_y);
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (size_t j = 0; j < tile_size_y; j++) {
          for (size_t i = 0; i < tile_size_x; i++) {
            const size_t ii =
                static_cast<size_t>(exr_image.tiles[it].offset_x) *
                    tile_size_x +
                i;
            const size_t jj =
                static_cast<size_t>(exr_image.tiles[it].offset_y) *
                    tile_size_y +
                j;
            const size_t idx = ii + jj * static_cast<size_t>(exr_image.width);

            // out of region check.
            if (ii >= static_cast<size_t>(exr_image.width)) {
              continue;
            }
            if (jj >= static_cast<size_t>(exr_image.height)) {
              continue;
            }
            const size_t srcIdx = i + j * tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 3] =
                reinterpret_cast<float **>(src)[0][srcIdx];
          }
        }
      }
    } else {
      const size_t pixel_size = static_cast<size_t>(exr_image.width) *
        static_cast<size_t>(exr_image.height);
      for (size_t i = 0; i < pixel_size; i++) {
        const float val = reinterpret_cast<float **>(exr_image.images)[0][i];
        (*out_rgba)[4 * i + 0] = val;
        (*out_rgba)[4 * i + 1] = val;
        (*out_rgba)[4 * i + 2] = val;
        (*out_rgba)[4 * i + 3] = val;
      }
    }

  } else {
    // TODO(syoyo): Support non RGBA image.

    if (idxR == -1) {
      tinyexr::SetErrorMessage("R channel not found", err);

      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxG == -1) {
      tinyexr::SetErrorMessage("G channel not found", err);
      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxB == -1) {
      tinyexr::SetErrorMessage("B channel not found", err);
      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      const size_t tile_size_x = static_cast<size_t>(exr_header.tile_size_x);
      const size_t tile_size_y = static_cast<size_t>(exr_header.tile_size_y);
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (size_t j = 0; j < tile_size_y; j++)
          for (size_t i = 0; i < tile_size_x; i++) {
            const size_t ii =
                static_cast<size_t>(exr_image.tiles[it].offset_x) *
                    tile_size_x +
                i;
            const size_t jj =
                static_cast<size_t>(exr_image.tiles[it].offset_y) *
                    tile_size_y +
                j;
            const size_t idx = ii + jj * static_cast<size_t>(exr_image.width);

            // out of region check.
            if (ii >= static_cast<size_t>(exr_image.width)) {
              continue;
            }
            if (jj >= static_cast<size_t>(exr_image.height)) {
              continue;
            }
            const size_t srcIdx = i + j * tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[idxR][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[idxG][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[idxB][srcIdx];
            if (idxA != -1) {
              (*out_rgba)[4 * idx + 3] =
                  reinterpret_cast<float **>(src)[idxA][srcIdx];
            } else {
              (*out_rgba)[4 * idx + 3] = 1.0;
            }
          }
      }
    } else {
      const size_t pixel_size = static_cast<size_t>(exr_image.width) *
        static_cast<size_t>(exr_image.height);
      for (size_t i = 0; i < pixel_size; i++) {
        (*out_rgba)[4 * i + 0] =
            reinterpret_cast<float **>(exr_image.images)[idxR][i];
        (*out_rgba)[4 * i + 1] =
            reinterpret_cast<float **>(exr_image.images)[idxG][i];
        (*out_rgba)[4 * i + 2] =
            reinterpret_cast<float **>(exr_image.images)[idxB][i];
        if (idxA != -1) {
          (*out_rgba)[4 * i + 3] =
              reinterpret_cast<float **>(exr_image.images)[idxA][i];
        } else {
          (*out_rgba)[4 * i + 3] = 1.0;
        }
      }
    }
  }

  (*width) = exr_image.width;
  (*height) = exr_image.height;

  FreeEXRHeader(&exr_header);
  FreeEXRImage(&exr_image);

  return TINYEXR_SUCCESS;
}